

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

Vec2 __thiscall tcu::clampLodBounds(tcu *this,Vec2 *lodBounds,Vec2 *lodMinMax,LodPrecision *prec)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  Vec2 VVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar8 [16];
  
  fVar4 = TexVerifierUtil::computeFixedPointError(prec->lodBits);
  auVar7._0_4_ = lodMinMax->m_data[1] - fVar4;
  fVar10 = fVar4 + lodMinMax->m_data[0];
  fVar6 = lodMinMax->m_data[0] - fVar4;
  auVar8._4_8_ = 0;
  auVar8._0_4_ = auVar7._0_4_;
  auVar8._12_4_ = extraout_XMM0_Db;
  auVar7._8_8_ = auVar8._8_8_;
  auVar7._4_4_ = fVar4 + lodMinMax->m_data[1];
  uVar1 = *(ulong *)lodBounds->m_data;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9 = minps(auVar7,auVar9);
  uVar2 = -(uint)((float)uVar1 < fVar6);
  uVar3 = -(uint)((float)(uVar1 >> 0x20) < fVar10);
  VVar5.m_data = (float  [2])
                 (CONCAT44(~uVar3 & auVar9._4_4_,~uVar2 & auVar9._0_4_) |
                 CONCAT44((uint)fVar10 & uVar3,(uint)fVar6 & uVar2));
  *(float (*) [2])this = VVar5.m_data;
  return (Vec2)VVar5.m_data;
}

Assistant:

Vec2 clampLodBounds (const Vec2& lodBounds, const Vec2& lodMinMax, const LodPrecision& prec)
{
	const float lodErr	= computeFixedPointError(prec.lodBits);
	const float	a		= lodMinMax.x();
	const float	b		= lodMinMax.y();
	return Vec2(de::clamp(lodBounds.x(), a-lodErr, b-lodErr), de::clamp(lodBounds.y(), a+lodErr, b+lodErr));
}